

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall
duckdb::UpdateSegment::FetchRow
          (UpdateSegment *this,TransactionData transaction,idx_t row_id,Vector *result,
          idx_t result_idx)

{
  idx_t iVar1;
  fetch_row_function_t p_Var2;
  pointer *__ptr;
  ulong uVar3;
  StorageLockKey *pSVar4;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferReference pin;
  StorageLock local_78;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  uVar3 = row_id - this->column_data->start;
  pSVar4 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock(&local_78);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)&local_78);
  local_68 = GetUpdateNode(this,pSVar4,uVar3 >> 0xb);
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    iVar1 = this->column_data->start;
    local_78.internals.internal.
    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result;
    UndoBufferPointer::Pin(&local_58,&local_68);
    p_Var2 = this->fetch_row_function;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
    (*p_Var2)(transaction.start_time,transaction.transaction_id,
              (UpdateInfo *)((local_58.handle.node.ptr)->buffer + local_58.position),
              row_id - ((uVar3 & 0xfffffffffffff800) + iVar1),
              (Vector *)
              local_78.internals.internal.
              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi,result_idx);
    BufferHandle::~BufferHandle(&local_58.handle);
  }
  if (local_78.internals.internal.
      super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    StorageLockKey::~StorageLockKey
              ((StorageLockKey *)
               local_78.internals.internal.
               super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    operator_delete(local_78.internals.internal.
                    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  return;
}

Assistant:

void UpdateSegment::FetchRow(TransactionData transaction, idx_t row_id, Vector &result, idx_t result_idx) {
	idx_t vector_index = (row_id - column_data.start) / STANDARD_VECTOR_SIZE;
	auto lock_handle = lock.GetSharedLock();
	auto entry = GetUpdateNode(*lock_handle, vector_index);
	if (!entry.IsSet()) {
		return;
	}
	idx_t row_in_vector = (row_id - column_data.start) - vector_index * STANDARD_VECTOR_SIZE;
	auto pin = entry.Pin();
	fetch_row_function(transaction.start_time, transaction.transaction_id, UpdateInfo::Get(pin), row_in_vector, result,
	                   result_idx);
}